

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

bool __thiscall psy::C::Parser::ignoreDeclarator(Parser *this)

{
  SyntaxKind SVar1;
  SyntaxToken *this_00;
  Parser *this_local;
  
  while( true ) {
    this_00 = peek(this,1);
    SVar1 = SyntaxToken::kind(this_00);
    if (SVar1 == EndOfFile) {
      return false;
    }
    if (SVar1 == IdentifierToken) {
      return false;
    }
    if ((SVar1 == CloseBraceToken) || (SVar1 == SemicolonToken)) {
      consume(this);
      return false;
    }
    if (SVar1 == AsteriskToken) {
      return false;
    }
    if (SVar1 == CommaToken) break;
    consume(this);
  }
  return false;
}

Assistant:

bool Parser::ignoreDeclarator()
{
    while (true) {
        switch (peek().kind()) {
            // Just return.
            case SyntaxKind::EndOfFile:
            case SyntaxKind::CommaToken:
            case SyntaxKind::IdentifierToken:
            case SyntaxKind::AsteriskToken:
                return false;

            // Skip and return.
            case SyntaxKind::SemicolonToken:
            case SyntaxKind::CloseBraceToken:
                consume();
                return false;

            // Skip.
            default:
                consume();
        }
    }
}